

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timebase_helper.c
# Opt level: O0

void helper_store_dcr_ppc64(CPUPPCState_conflict2 *env,target_ulong dcrn,target_ulong val)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  int ret;
  target_ulong val_local;
  target_ulong dcrn_local;
  CPUPPCState_conflict2 *env_local;
  
  if (env->dcr_env == (ppc_dcr_t *)0x0) {
    raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
  }
  iVar1 = ppc_dcr_write_ppc64(env->dcr_env,(int)dcrn,(uint32_t)val);
  if (iVar1 != 0) {
    raise_exception_err_ra_ppc64(env,6,0x22,unaff_retaddr);
  }
  return;
}

Assistant:

void helper_store_dcr(CPUPPCState *env, target_ulong dcrn, target_ulong val)
{
    if (unlikely(env->dcr_env == NULL)) {
#if 0
        qemu_log_mask(LOG_GUEST_ERROR, "No DCR environment\n");
#endif
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    } else {
        int ret;
        ret = ppc_dcr_write(env->dcr_env, (uint32_t)dcrn, (uint32_t)val);
        if (unlikely(ret != 0)) {
#if 0
            qemu_log_mask(LOG_GUEST_ERROR, "DCR write error %d %03x\n",
                          (uint32_t)dcrn, (uint32_t)dcrn);
#endif
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_PRIV_REG, GETPC());
        }
    }
}